

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

int4 __thiscall TypeStruct::compareDependency(TypeStruct *this,Datatype *op)

{
  int iVar1;
  type_metatype tVar2;
  Datatype *pDVar3;
  bool bVar4;
  int4 iVar5;
  type_metatype tVar6;
  size_type sVar7;
  size_type sVar8;
  reference pTVar9;
  reference pTVar10;
  Datatype *fld2;
  Datatype *fld1;
  TypeField *local_48;
  TypeField *local_40;
  __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_> local_38
  ;
  const_iterator iter2;
  const_iterator iter1;
  TypeStruct *ts;
  Datatype *op_local;
  TypeStruct *this_local;
  
  iVar1 = (this->super_Datatype).size;
  iVar5 = Datatype::getSize(op);
  if (iVar1 == iVar5) {
    tVar2 = (this->super_Datatype).metatype;
    tVar6 = Datatype::getMetatype(op);
    if (tVar2 == tVar6) {
      __gnu_cxx::
      __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
      __normal_iterator(&iter2);
      __gnu_cxx::
      __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
      __normal_iterator(&local_38);
      sVar7 = std::vector<TypeField,_std::allocator<TypeField>_>::size(&this->field);
      sVar8 = std::vector<TypeField,_std::allocator<TypeField>_>::size
                        ((vector<TypeField,_std::allocator<TypeField>_> *)(op + 1));
      if (sVar7 == sVar8) {
        local_40 = (TypeField *)
                   std::vector<TypeField,_std::allocator<TypeField>_>::begin(&this->field);
        iter2._M_current = local_40;
        local_48 = (TypeField *)
                   std::vector<TypeField,_std::allocator<TypeField>_>::begin
                             ((vector<TypeField,_std::allocator<TypeField>_> *)(op + 1));
        local_38._M_current = local_48;
        while( true ) {
          fld1 = (Datatype *)std::vector<TypeField,_std::allocator<TypeField>_>::end(&this->field);
          bVar4 = __gnu_cxx::operator!=
                            (&iter2,(__normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                                     *)&fld1);
          if (!bVar4) break;
          pTVar9 = __gnu_cxx::
                   __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                   ::operator*(&iter2);
          iVar1 = pTVar9->offset;
          pTVar9 = __gnu_cxx::
                   __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                   ::operator*(&local_38);
          if (iVar1 != pTVar9->offset) {
            pTVar9 = __gnu_cxx::
                     __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                     ::operator*(&iter2);
            iVar1 = pTVar9->offset;
            pTVar9 = __gnu_cxx::
                     __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                     ::operator*(&local_38);
            if (pTVar9->offset <= iVar1) {
              return 1;
            }
            return -1;
          }
          pTVar9 = __gnu_cxx::
                   __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                   ::operator*(&iter2);
          pTVar10 = __gnu_cxx::
                    __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                    ::operator*(&local_38);
          bVar4 = std::operator!=(&pTVar9->name,&pTVar10->name);
          if (bVar4) {
            pTVar9 = __gnu_cxx::
                     __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                     ::operator*(&iter2);
            pTVar10 = __gnu_cxx::
                      __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                      ::operator*(&local_38);
            bVar4 = std::operator<(&pTVar9->name,&pTVar10->name);
            if (!bVar4) {
              return 1;
            }
            return -1;
          }
          pTVar9 = __gnu_cxx::
                   __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                   ::operator*(&iter2);
          pDVar3 = pTVar9->type;
          pTVar9 = __gnu_cxx::
                   __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                   ::operator*(&local_38);
          if (pDVar3 != pTVar9->type) {
            if (pTVar9->type <= pDVar3) {
              return 1;
            }
            return -1;
          }
          __gnu_cxx::
          __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
          ::operator++(&iter2);
          __gnu_cxx::
          __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
          ::operator++(&local_38);
        }
        this_local._4_4_ = 0;
      }
      else {
        sVar7 = std::vector<TypeField,_std::allocator<TypeField>_>::size
                          ((vector<TypeField,_std::allocator<TypeField>_> *)(op + 1));
        sVar8 = std::vector<TypeField,_std::allocator<TypeField>_>::size(&this->field);
        this_local._4_4_ = (int)sVar7 - (int)sVar8;
      }
    }
    else {
      tVar2 = (this->super_Datatype).metatype;
      tVar6 = Datatype::getMetatype(op);
      this_local._4_4_ = 1;
      if ((int)tVar2 < (int)tVar6) {
        this_local._4_4_ = -1;
      }
    }
  }
  else {
    iVar5 = Datatype::getSize(op);
    this_local._4_4_ = iVar5 - (this->super_Datatype).size;
  }
  return this_local._4_4_;
}

Assistant:

int4 TypeStruct::compareDependency(const Datatype &op) const

{
  if (size != op.getSize()) return (op.getSize()-size);
  if (metatype != op.getMetatype()) return (metatype < op.getMetatype()) ? -1 : 1;

  const TypeStruct *ts = (const TypeStruct *)&op;
  vector<TypeField>::const_iterator iter1,iter2;

  if (field.size() != ts->field.size()) return (ts->field.size()-field.size());
  iter1 = field.begin();
  iter2 = ts->field.begin();
  // Test only the name and first level metatype first
  while(iter1 != field.end()) {
    if ((*iter1).offset != (*iter2).offset)
      return ((*iter1).offset < (*iter2).offset) ? -1:1;
    if ((*iter1).name != (*iter2).name)
      return ((*iter1).name < (*iter2).name) ? -1:1;
    Datatype *fld1 = (*iter1).type;
    Datatype *fld2 = (*iter2).type;
    if (fld1 != fld2)
      return (fld1 < fld2) ? -1 : 1; // compare the pointers directly
    ++iter1;
    ++iter2;
  }
  return 0;
}